

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
gt_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (gt_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_4)

{
  bool bVar1;
  type_conflict9 tVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar4;
  semantic_tag sVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *lhs_00;
  
  lhs_00 = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(in_RDX);
  if ((bVar1) &&
     (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(in_RDX),
     bVar1)) {
    tVar2 = operator>(lhs_00,in_RDI);
    sVar5 = (semantic_tag)((ulong)in_RDI >> 0x30);
    bVar1 = SUB81((ulong)in_RDI >> 0x38,0);
    if (tVar2) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (lhs_00,bVar1,sVar5);
      uVar3 = extraout_RDX;
    }
    else {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (lhs_00,bVar1,sVar5);
      uVar3 = extraout_RDX_00;
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(in_RDX);
    if ((bVar1) &&
       (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(in_RDX),
       bVar1)) {
      tVar2 = operator>(lhs_00,in_RDI);
      sVar5 = (semantic_tag)((ulong)in_RDI >> 0x30);
      bVar1 = SUB81((ulong)in_RDI >> 0x38,0);
      if (tVar2) {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (lhs_00,bVar1,sVar5);
        uVar3 = extraout_RDX_01;
      }
      else {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (lhs_00,bVar1,sVar5);
        uVar3 = extraout_RDX_02;
      }
    }
    else {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(lhs_00,in_RDI);
      uVar3 = extraout_RDX_03;
    }
  }
  bVar4.field_0.int64_.val_ = uVar3;
  bVar4.field_0._0_8_ = lhs_00;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar4.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            //std::cout << "operator> lhs: " << lhs << ", rhs: " << rhs << "\n";

            if (lhs.is_number() && rhs.is_number())
            {
                return lhs > rhs ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
            }
            if (lhs.is_string() && rhs.is_string())
            {
                return lhs > rhs ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
            }
            return Json::null();
        }